

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::ScanfFunc::ScanfFunc(ScanfFunc *this,bool isFscanf)

{
  undefined7 in_register_00000031;
  KnownSystemName ksn;
  string_view sVar1;
  
  ksn = (KnownSystemName)CONCAT71(in_register_00000031,isFscanf) ^ SScanf;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_00630110;
  sVar1 = parsing::toString(ksn);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = ksn;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0062d718;
  this->isFscanf = isFscanf;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  (this->super_SystemSubroutine).neverReturns = false;
  return;
}

Assistant:

explicit ScanfFunc(bool isFscanf) :
        SystemSubroutine(isFscanf ? KnownSystemName::FScanf : KnownSystemName::SScanf,
                         SubroutineKind::Function),
        isFscanf(isFscanf) {
        hasOutputArgs = true;
    }